

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::stage_limits_are_supported
          (Impl *this,VkPipelineShaderStageCreateInfo *info)

{
  VkShaderStageFlagBits VVar1;
  bool bVar2;
  pointer pvVar3;
  reference pDVar4;
  VkSpecializationMapEntry *pVVar5;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *pVVar6;
  uint local_d0;
  uint32_t target_subgroup_size;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *required;
  VkSpecializationMapEntry *map_entry;
  uint j;
  uint8_t *data;
  uint i;
  uint32_t wg_size [3];
  DeferredEntryPoint *entry_1;
  DeferredEntryPoint *entry;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
  *__range1;
  DeferredEntryPoint *deferred_entry_point;
  _Node_iterator_base<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false>
  local_50;
  _Node_iterator_base<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false>
  local_48;
  const_iterator itr;
  lock_guard<std::mutex> holder;
  undefined8 uStack_30;
  uint32_t limit_invocations;
  uint32_t limit_workgroup_size [3];
  ExecutionModel target_model;
  VkPipelineShaderStageCreateInfo *info_local;
  Impl *this_local;
  
  if (info->pName == (char *)0x0) {
    return false;
  }
  VVar1 = info->stage;
  if (VVar1 == VK_SHADER_STAGE_COMPUTE_BIT) {
    limit_workgroup_size[1] = 5;
    uStack_30 = *(undefined8 *)(this->props2).properties.limits.maxComputeWorkGroupSize;
    limit_workgroup_size[0] = (this->props2).properties.limits.maxComputeWorkGroupSize[2];
    holder._M_device._4_4_ = (this->props2).properties.limits.maxComputeWorkGroupInvocations;
  }
  else if (VVar1 == VK_SHADER_STAGE_TASK_BIT_EXT) {
    limit_workgroup_size[1] = 0x14f4;
    uStack_30 = *(undefined8 *)(this->props).mesh_shader.maxTaskWorkGroupSize;
    limit_workgroup_size[0] = (this->props).mesh_shader.maxTaskWorkGroupSize[2];
    holder._M_device._4_4_ = (this->props).mesh_shader.maxTaskWorkGroupInvocations;
  }
  else {
    if (VVar1 != VK_SHADER_STAGE_MESH_BIT_EXT) {
      return true;
    }
    limit_workgroup_size[1] = 0x14f5;
    uStack_30 = *(undefined8 *)(this->props).mesh_shader.maxMeshWorkGroupSize;
    limit_workgroup_size[0] = (this->props).mesh_shader.maxMeshWorkGroupSize[2];
    holder._M_device._4_4_ = (this->props).mesh_shader.maxMeshWorkGroupInvocations;
  }
  unique0x100005a9 = info;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&itr,&this->module_to_info_lock)
  ;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<VkShaderModule_T_*,_Fossilize::FeatureFilter::Impl::ModuleInfo,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>_>
       ::find(&this->module_to_info,&stack0xffffffffffffffe0->module);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<VkShaderModule_T_*,_Fossilize::FeatureFilter::Impl::ModuleInfo,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>_>
       ::end(&this->module_to_info);
  bVar2 = std::__detail::operator==(&local_48,&local_50);
  if (bVar2) {
    this_local._7_1_ = true;
    goto LAB_00241fc2;
  }
  __range1 = (vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
              *)0x0;
  pvVar3 = std::__detail::
           _Node_const_iterator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false,_false>
           ::operator->((_Node_const_iterator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false,_false>
                         *)&local_48);
  __end1 = std::
           vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
           ::begin(&(pvVar3->second).deferred_entry_points);
  entry = (DeferredEntryPoint *)
          std::
          vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
          ::end(&(pvVar3->second).deferred_entry_points);
  while ((bVar2 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<const_Fossilize::FeatureFilter::Impl::DeferredEntryPoint_*,_std::vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>_>
                                      *)&entry), pDVar4 = (reference)__range1, bVar2 &&
         ((pDVar4 = __gnu_cxx::
                    __normal_iterator<const_Fossilize::FeatureFilter::Impl::DeferredEntryPoint_*,_std::vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>_>
                    ::operator*(&__end1), limit_workgroup_size[1] != pDVar4->execution_model ||
          (bVar2 = std::operator==(&pDVar4->name,stack0xffffffffffffffe0->pName), !bVar2))))) {
    __gnu_cxx::
    __normal_iterator<const_Fossilize::FeatureFilter::Impl::DeferredEntryPoint_*,_std::vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>_>
    ::operator++(&__end1);
  }
  __range1 = (vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
              *)pDVar4;
  if (__range1 !=
      (vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
       *)0x0) {
    wg_size._4_8_ = __range1;
    memset((void *)((long)&data + 4),0,0xc);
    if (*(int *)(wg_size._4_8_ + 0x50) == 0x14f5) {
      if ((this->props).mesh_shader.maxMeshOutputPrimitives < *(uint *)(wg_size._4_8_ + 0x58)) {
        this_local._7_1_ = false;
        goto LAB_00241fc2;
      }
      if ((this->props).mesh_shader.maxMeshOutputVertices < *(uint *)(wg_size._4_8_ + 0x54)) {
        this_local._7_1_ = false;
        goto LAB_00241fc2;
      }
    }
    for (data._0_4_ = 0; (uint)data < 3; data._0_4_ = (uint)data + 1) {
      *(undefined4 *)((long)&data + (ulong)(uint)data * 4 + 4) =
           *(undefined4 *)(wg_size._4_8_ + 4 + (ulong)(uint)data * 4);
      if (((*(byte *)(wg_size._4_8_ + 0x28 + (ulong)(uint)data) & 1) != 0) &&
         (stack0xffffffffffffffe0->pSpecializationInfo != (VkSpecializationInfo *)0x0)) {
        for (map_entry._4_4_ = 0;
            map_entry._4_4_ < stack0xffffffffffffffe0->pSpecializationInfo->mapEntryCount;
            map_entry._4_4_ = map_entry._4_4_ + 1) {
          pVVar5 = stack0xffffffffffffffe0->pSpecializationInfo->pMapEntries + map_entry._4_4_;
          if (((pVVar5->constantID == *(uint32_t *)(wg_size._4_8_ + 0x1c + (ulong)(uint)data * 4))
              && (pVVar5->size == 4)) &&
             ((ulong)pVVar5->offset + 4 <= stack0xffffffffffffffe0->pSpecializationInfo->dataSize))
          {
            *(undefined4 *)((long)&data + (ulong)(uint)data * 4 + 4) =
                 *(undefined4 *)
                  ((long)stack0xffffffffffffffe0->pSpecializationInfo->pData + (ulong)pVVar5->offset
                  );
            break;
          }
        }
      }
      if (*(uint *)((long)&stack0xffffffffffffffd0 + (ulong)(uint)data * 4) <
          *(uint *)((long)&data + (ulong)(uint)data * 4 + 4)) {
        this_local._7_1_ = false;
        goto LAB_00241fc2;
      }
    }
    if (holder._M_device._4_4_ < data._4_4_ * i * wg_size[0]) {
      this_local._7_1_ = false;
      goto LAB_00241fc2;
    }
    if ((stack0xffffffffffffffe0->flags & 2) != 0) {
      pVVar6 = find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfo>
                         (VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO
                          ,stack0xffffffffffffffe0->pNext);
      if (pVVar6 == (VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *)0x0) {
        local_d0 = (this->props).subgroup_size_control.maxSubgroupSize;
      }
      else {
        local_d0 = pVVar6->requiredSubgroupSize;
      }
      if (local_d0 == 0) {
        this_local._7_1_ = false;
        goto LAB_00241fc2;
      }
      if (data._4_4_ % local_d0 != 0) {
        this_local._7_1_ = false;
        goto LAB_00241fc2;
      }
    }
  }
  this_local._7_1_ = true;
LAB_00241fc2:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::stage_limits_are_supported(const VkPipelineShaderStageCreateInfo &info) const
{
	spv::ExecutionModel target_model;
	uint32_t limit_workgroup_size[3];
	uint32_t limit_invocations;

	if (!info.pName)
		return false;

	switch (info.stage)
	{
	case VK_SHADER_STAGE_COMPUTE_BIT:
		target_model = spv::ExecutionModelGLCompute;
		memcpy(limit_workgroup_size, props2.properties.limits.maxComputeWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props2.properties.limits.maxComputeWorkGroupInvocations;
		break;

	case VK_SHADER_STAGE_TASK_BIT_EXT:
		target_model = spv::ExecutionModelTaskEXT;
		memcpy(limit_workgroup_size, props.mesh_shader.maxTaskWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props.mesh_shader.maxTaskWorkGroupInvocations;
		break;

	case VK_SHADER_STAGE_MESH_BIT_EXT:
		target_model = spv::ExecutionModelMeshEXT;
		memcpy(limit_workgroup_size, props.mesh_shader.maxMeshWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props.mesh_shader.maxMeshWorkGroupInvocations;
		break;

	default:
		// Shouldn't happen. Only happens for invalid input.
		return true;
	}

	std::lock_guard<std::mutex> holder{module_to_info_lock};

	// If we cannot find anything, assume that we're statically okay.
	auto itr = module_to_info.find(info.module);
	if (itr == module_to_info.end())
		return true;

	const DeferredEntryPoint *deferred_entry_point = nullptr;
	for (auto &entry : itr->second.deferred_entry_points)
	{
		if (target_model == entry.execution_model && entry.name == info.pName)
		{
			deferred_entry_point = &entry;
			break;
		}
	}

	if (deferred_entry_point)
	{
		auto &entry = *deferred_entry_point;
		uint32_t wg_size[3] = {};

		if (entry.execution_model == spv::ExecutionModelMeshEXT)
		{
			if (entry.max_primitives > props.mesh_shader.maxMeshOutputPrimitives)
				return false;
			if (entry.max_vertices > props.mesh_shader.maxMeshOutputVertices)
				return false;
		}

		for (unsigned i = 0; i < 3; i++)
		{
			wg_size[i] = entry.wg_size_literal[i];
			if (entry.has_constant_id[i] && info.pSpecializationInfo)
			{
				auto *data = static_cast<const uint8_t *>(info.pSpecializationInfo->pData);
				for (unsigned j = 0; j < info.pSpecializationInfo->mapEntryCount; j++)
				{
					auto &map_entry = info.pSpecializationInfo->pMapEntries[j];
					if (map_entry.constantID == entry.constant_id[i] &&
					    map_entry.size == sizeof(uint32_t) &&
					    map_entry.offset + sizeof(uint32_t) <= info.pSpecializationInfo->dataSize)
					{
						memcpy(&wg_size[i], data + map_entry.offset, sizeof(uint32_t));
						break;
					}
				}
			}

			if (wg_size[i] > limit_workgroup_size[i])
				return false;
		}

		if (wg_size[0] * wg_size[1] * wg_size[2] > limit_invocations)
			return false;

		if (info.flags & VK_PIPELINE_SHADER_STAGE_CREATE_REQUIRE_FULL_SUBGROUPS_BIT)
		{
			auto *required = find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT>(
					VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT,
					info.pNext);

			uint32_t target_subgroup_size = required ?
					required->requiredSubgroupSize : props.subgroup_size_control.maxSubgroupSize;

			if (!target_subgroup_size)
				return false;

			if (wg_size[0] % target_subgroup_size != 0)
			{
				// Can only use full subgroups if we're guaranteed maxSubgroupSize is contained.
				// If we're using required size, we can statically validate it.
				return false;
			}
		}
	}

	return true;
}